

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VCVT_sp_int(DisasContext_conflict1 *s,arg_VCVT_sp_int *a)

{
  uint uVar1;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  uint uVar3;
  TCGTemp *pTVar4;
  TCGTemp *ret;
  code *func;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar1 = s->isar->mvfr0;
  if ((uVar1 & 0xf0) != 0) {
    s_00 = s->uc->tcg_ctx;
    _Var2 = full_vfp_access_check(s,false);
    if (_Var2) {
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_aarch64
                (s_00,(TCGv_i64)((long)pTVar4 - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
      ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      uVar3 = a->vm << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)(uVar3 & 4) + ((ulong)(uVar3 & 8) | (ulong)((uint)a->vm >> 2) << 8)
                          + 0xc10);
      if (a->s == 0) {
        if (a->rz == 0) {
          func = helper_vfp_touis_aarch64;
        }
        else {
          func = helper_vfp_touizs_aarch64;
        }
      }
      else if (a->rz == 0) {
        func = helper_vfp_tosis_aarch64;
      }
      else {
        func = helper_vfp_tosizs_aarch64;
      }
      local_48 = ret;
      local_40 = pTVar4;
      tcg_gen_callN_aarch64(s_00,func,ret,2,&local_48);
      uVar3 = a->vd << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)(uVar3 & 4) + ((ulong)(uVar3 & 8) | (ulong)((uint)a->vd >> 2) << 8)
                          + 0xc10);
      tcg_temp_free_internal_aarch64(s_00,ret);
      tcg_temp_free_internal_aarch64
                (s_00,(TCGTemp *)((TCGv_i64)((long)pTVar4 - (long)s_00) + (long)s_00));
    }
  }
  return (uVar1 & 0xf0) != 0;
}

Assistant:

static bool trans_VCVT_sp_int(DisasContext *s, arg_VCVT_sp_int *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 vm;
    TCGv_ptr fpst;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    vm = tcg_temp_new_i32(tcg_ctx);
    neon_load_reg32(tcg_ctx, vm, a->vm);

    if (a->s) {
        if (a->rz) {
            gen_helper_vfp_tosizs(tcg_ctx, vm, vm, fpst);
        } else {
            gen_helper_vfp_tosis(tcg_ctx, vm, vm, fpst);
        }
    } else {
        if (a->rz) {
            gen_helper_vfp_touizs(tcg_ctx, vm, vm, fpst);
        } else {
            gen_helper_vfp_touis(tcg_ctx, vm, vm, fpst);
        }
    }
    neon_store_reg32(tcg_ctx, vm, a->vd);
    tcg_temp_free_i32(tcg_ctx, vm);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    return true;
}